

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundfiles.c
# Opt level: O0

int ps_config_wavfile(ps_config_t *config,FILE *infh,char *file)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  void *pvVar5;
  char *spam_1;
  char *spam;
  short local_2e;
  int rv;
  uint uStack_28;
  int16 shortval;
  int32 header_len;
  int32 intval;
  char id [4];
  char *file_local;
  FILE *infh_local;
  ps_config_t *config_local;
  
  spam._4_4_ = 0;
  _intval = file;
  if (file == (char *)0x0) {
    _intval = "(input filehandle)";
  }
  ps_config_set_str(config,"input_endian","little");
  sVar3 = fread(&header_len,1,4,(FILE *)infh);
  if (sVar3 == 4) {
    sVar3 = fread(&stack0xffffffffffffffd8,4,1,(FILE *)infh);
    if (sVar3 == 1) {
      sVar3 = fread(&header_len,1,4,(FILE *)infh);
      if (sVar3 == 4) {
        iVar2 = memcmp(&header_len,"WAVE",4);
        if (iVar2 == 0) {
          sVar3 = fread(&header_len,1,4,(FILE *)infh);
          if (sVar3 == 4) {
            iVar2 = memcmp(&header_len,"fmt ",4);
            if (iVar2 == 0) {
              sVar3 = fread(&stack0xffffffffffffffd8,4,1,(FILE *)infh);
              if (sVar3 == 1) {
                rv = uStack_28;
                sVar3 = fread(&local_2e,2,1,(FILE *)infh);
                if (sVar3 == 1) {
                  if (local_2e == 1) {
                    sVar3 = fread(&local_2e,2,1,(FILE *)infh);
                    if (sVar3 == 1) {
                      if (local_2e == 1) {
                        sVar3 = fread(&stack0xffffffffffffffd8,4,1,(FILE *)infh);
                        if (sVar3 == 1) {
                          lVar4 = ps_config_int(config,"samprate");
                          if (lVar4 == 0) {
                            ps_config_set_int(config,"samprate",(long)(int)uStack_28);
                          }
                          else {
                            lVar4 = ps_config_int(config,"samprate");
                            uVar1 = uStack_28;
                            if (lVar4 != (int)uStack_28) {
                              lVar4 = ps_config_int(config,"samprate");
                              err_msg(ERR_WARN,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                      ,0xa1,"WAVE file sampling rate %d != samprate %d\n",
                                      (ulong)uVar1,lVar4);
                            }
                          }
                          sVar3 = fread(&stack0xffffffffffffffd8,4,1,(FILE *)infh);
                          if (sVar3 == 1) {
                            sVar3 = fread(&local_2e,2,1,(FILE *)infh);
                            if (sVar3 == 1) {
                              sVar3 = fread(&local_2e,2,1,(FILE *)infh);
                              if (sVar3 == 1) {
                                if (local_2e == 0x10) {
                                  if (0x10 < rv) {
                                    pvVar5 = malloc((long)(rv + -0x10));
                                    sVar3 = fread(pvVar5,1,(long)(rv + -0x10),(FILE *)infh);
                                    if (sVar3 != (long)(rv + -0x10)) {
                                      err_msg_system(ERR_ERROR,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                                  ,0xb8,"%s: Failed to read extra header",_intval);
                                      spam._4_4_ = -1;
                                    }
                                    ckd_free(pvVar5);
                                    if (spam._4_4_ == -1) {
                                      return -1;
                                    }
                                  }
                                  do {
                                    sVar3 = fread(&header_len,1,4,(FILE *)infh);
                                    if (sVar3 != 4) {
                                      err_msg_system(ERR_ERROR,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                                  ,0xc2,"Failed to read %d bytes",4);
                                      return -1;
                                    }
                                    iVar2 = memcmp(&header_len,"data",4);
                                    if (iVar2 == 0) {
                                      sVar3 = fread(&stack0xffffffffffffffd8,4,1,(FILE *)infh);
                                      if (sVar3 == 1) {
                                        return spam._4_4_;
                                      }
                                      err_msg_system(ERR_ERROR,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                                  ,0xc5,"Failed to read %d bytes",4);
                                      return -1;
                                    }
                                    sVar3 = fread(&stack0xffffffffffffffd8,4,1,(FILE *)infh);
                                    if (sVar3 != 1) {
                                      err_msg_system(ERR_ERROR,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                                  ,0xcc,"Failed to read %d bytes",4);
                                      return -1;
                                    }
                                    pvVar5 = malloc((long)(int)uStack_28);
                                    sVar3 = fread(pvVar5,1,(long)(int)uStack_28,(FILE *)infh);
                                    if (sVar3 != (long)(int)uStack_28) {
                                      err_msg_system(ERR_ERROR,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                                  ,0xd1,"%s: Failed to read %s chunk",_intval,
                                                  &header_len);
                                      spam._4_4_ = -1;
                                    }
                                    ckd_free(pvVar5);
                                  } while (spam._4_4_ != -1);
                                }
                                else {
                                  err_msg(ERR_ERROR,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                          ,0xae,"%s is not 16-bit\n",_intval);
                                  spam._4_4_ = -1;
                                }
                              }
                              else {
                                err_msg_system(ERR_ERROR,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                               ,0xab,"Failed to read %d bytes",2);
                                spam._4_4_ = -1;
                              }
                            }
                            else {
                              err_msg_system(ERR_ERROR,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                             ,0xa8,"Failed to read %d bytes",2);
                              spam._4_4_ = -1;
                            }
                          }
                          else {
                            err_msg_system(ERR_ERROR,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                           ,0xa5,"Failed to read %d bytes",4);
                            spam._4_4_ = -1;
                          }
                        }
                        else {
                          err_msg_system(ERR_ERROR,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                         ,0x9b,"Failed to read %d bytes",4);
                          spam._4_4_ = -1;
                        }
                      }
                      else {
                        err_msg(ERR_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                ,0x95,"%s is not single channel\n",_intval);
                        spam._4_4_ = -1;
                      }
                    }
                    else {
                      err_msg_system(ERR_ERROR,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                     ,0x92,"Failed to read %d bytes",2);
                      spam._4_4_ = -1;
                    }
                  }
                  else {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                            ,0x8c,"%s is not in PCM format\n",_intval);
                    spam._4_4_ = -1;
                  }
                }
                else {
                  err_msg_system(ERR_ERROR,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                 ,0x89,"Failed to read %d bytes",2);
                  spam._4_4_ = -1;
                }
              }
              else {
                err_msg_system(ERR_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                               ,0x84,"Failed to read %d bytes",4);
                spam._4_4_ = -1;
              }
            }
            else {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                      ,0x7f,"Format chunk missing\n");
              spam._4_4_ = -1;
            }
          }
          else {
            err_msg_system(ERR_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                           ,0x7d,"Failed to read %d bytes",4);
            spam._4_4_ = -1;
          }
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                  ,0x78,"%s is not a WAVE file\n",_intval);
          spam._4_4_ = -1;
        }
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                       ,0x76,"Failed to read %d bytes",4);
        spam._4_4_ = -1;
      }
    }
    else {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                     ,0x74,"Failed to read %d bytes",4);
      spam._4_4_ = -1;
    }
  }
  else {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                   ,0x72,"Failed to read %d bytes",4);
    spam._4_4_ = -1;
  }
  return spam._4_4_;
}

Assistant:

int
ps_config_wavfile(ps_config_t *config, FILE *infh, const char *file)
{
    char id[4];
    int32 intval, header_len;
    int16 shortval;
    int rv = 0;

    if (file == NULL)
        file = "(input filehandle)";
        
    /* RIFF files are little-endian by definition. */
    ps_config_set_str(config, "input_endian", "little");

    /* Read in all the header chunks and etcetera. */
    TRY_FREAD(id, 1, 4, infh);
    /* Total file length (we don't care) */
    TRY_FREAD(&intval, 4, 1, infh);
    /* 'WAVE' */
    TRY_FREAD(id, 1, 4, infh);
    if (0 != memcmp(id, "WAVE", 4)) {
        E_ERROR("%s is not a WAVE file\n", file);
        rv = -1;
        goto error_out;
    }
    /* 'fmt ' */
    TRY_FREAD(id, 1, 4, infh);
    if (0 != memcmp(id, "fmt ", 4)) {
        E_ERROR("Format chunk missing\n");
        rv = -1;
        goto error_out;
    }
    /* Length of 'fmt ' chunk */
    TRY_FREAD(&intval, 4, 1, infh);
    SWAP_LE_32(&intval);
    header_len = intval;

    /* Data format. */
    TRY_FREAD(&shortval, 2, 1, infh);
    SWAP_LE_16(&shortval);
    if (shortval != 1) { /* PCM */
        E_ERROR("%s is not in PCM format\n", file);
        rv = -1;
        goto error_out;
    }

    /* Number of channels. */
    TRY_FREAD(&shortval, 2, 1, infh);
    SWAP_LE_16(&shortval);
    if (shortval != 1) { /* PCM */
        E_ERROR("%s is not single channel\n", file);
        rv = -1;
        goto error_out;
    }

    /* Sampling rate (finally!) */
    TRY_FREAD(&intval, 4, 1, infh);
    SWAP_LE_32(&intval);
    if (ps_config_int(config, "samprate") == 0)
        ps_config_set_int(config, "samprate", intval);
    else if (ps_config_int(config, "samprate") != intval) {
        E_WARN("WAVE file sampling rate %d != samprate %d\n",
               intval, ps_config_int(config, "samprate"));
    }

    /* Average bytes per second (we don't care) */
    TRY_FREAD(&intval, 4, 1, infh);

    /* Block alignment (we don't care) */
    TRY_FREAD(&shortval, 2, 1, infh);

    /* Bits per sample (must be 16) */
    TRY_FREAD(&shortval, 2, 1, infh);
    SWAP_LE_16(&shortval);
    if (shortval != 16) {
        E_ERROR("%s is not 16-bit\n", file);
        rv = -1;
        goto error_out;
    }

    /* Any extra parameters. */
    if (header_len > 16) {
        /* Avoid seeking... */
        char *spam = malloc(header_len - 16);
        if (fread(spam, 1, header_len - 16, infh) != (size_t)(header_len - 16)) {
            E_ERROR_SYSTEM("%s: Failed to read extra header", file);
            rv = -1;
        }
        ckd_free(spam);
        if (rv == -1)
            goto error_out;
    }

    /* Now skip to the 'data' chunk. */
    while (1) {
        TRY_FREAD(id, 1, 4, infh);
        if (0 == memcmp(id, "data", 4)) {
            /* Total number of bytes of data (we don't care). */
            TRY_FREAD(&intval, 4, 1, infh);
            break;
        }
        else {
            char *spam;
            /* Some other stuff... */
            /* Number of bytes of ... whatever */
            TRY_FREAD(&intval, 4, 1, infh);
            SWAP_LE_32(&intval);
            /* Avoid seeking... */
            spam = malloc(intval);
            if (fread(spam, 1, intval, infh) != (size_t)intval) {
                E_ERROR_SYSTEM("%s: Failed to read %s chunk", file, id);
                rv = -1;
            }
            ckd_free(spam);
            if (rv == -1)
                goto error_out;
        }
    }

error_out:
    return rv;
}